

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::EnumValBuilder::AssignEnumeratorValue(EnumValBuilder *this,string *value)

{
  string *msg;
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int64_t local_38;
  int64_t i64;
  uint64_t u64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_20;
  bool fit;
  string *value_local;
  EnumValBuilder *this_local;
  
  (value->field_2)._M_local_buf[8] = '\x01';
  u64._7_1_ = 0;
  pbStack_20 = in_RDX;
  value_local = value;
  this_local = this;
  bVar1 = EnumDef::IsUInt64((EnumDef *)value->_M_string_length);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    u64._7_1_ = StringToNumber<unsigned_long>(pcVar2,(uint64_t *)&i64);
    *(int64_t *)((value->field_2)._M_allocated_capacity + 0xa0) = i64;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    u64._7_1_ = StringToNumber<long>(pcVar2,&local_38);
    *(int64_t *)((value->field_2)._M_allocated_capacity + 0xa0) = local_38;
  }
  if ((bool)u64._7_1_ == false) {
    msg = *(string **)value;
    std::operator+(&local_78,"enum value does not fit, \"",pbStack_20);
    std::operator+(&local_58,&local_78,"\"");
    Parser::Error((Parser *)this,msg);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    anon_unknown_0::NoError();
  }
  return SUB82(this,0);
}

Assistant:

FLATBUFFERS_CHECKED_ERROR AssignEnumeratorValue(const std::string &value) {
    user_value = true;
    auto fit = false;
    if (enum_def.IsUInt64()) {
      uint64_t u64;
      fit = StringToNumber(value.c_str(), &u64);
      temp->value = static_cast<int64_t>(u64);  // well-defined since C++20.
    } else {
      int64_t i64;
      fit = StringToNumber(value.c_str(), &i64);
      temp->value = i64;
    }
    if (!fit) return parser.Error("enum value does not fit, \"" + value + "\"");
    return NoError();
  }